

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FloatStateQueryVerifiers::GetFloatVerifier::verifyFloat4Color
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1,GLfloat reference2,GLfloat reference3)

{
  ostringstream *this_00;
  bool bVar1;
  StateQueryMemoryWriteGuard<float[4]> floatVector4;
  StateQueryMemoryWriteGuard<float[4]> local_1c8;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  local_1c8.m_postguard[0] = -8.0297587e+18;
  local_1c8.m_postguard[1] = -8.0297587e+18;
  local_1c8.m_postguard[2] = -8.0297587e+18;
  local_1c8.m_postguard[3] = -8.0297587e+18;
  local_1c8.m_value[0] = -8.0297587e+18;
  local_1c8.m_value[1] = -8.0297587e+18;
  local_1c8.m_value[2] = -8.0297587e+18;
  local_1c8.m_value[3] = -8.0297587e+18;
  local_1c8.m_preguard[0] = -8.0297587e+18;
  local_1c8.m_preguard[1] = -8.0297587e+18;
  local_1c8.m_preguard[2] = -8.0297587e+18;
  local_1c8.m_preguard[3] = -8.0297587e+18;
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1c8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                    (&local_1c8,testCtx);
  if (bVar1) {
    if ((local_1c8.m_value[0] == reference0) && (!NAN(local_1c8.m_value[0]) && !NAN(reference0))) {
      if ((local_1c8.m_value[1] == reference1) && (!NAN(local_1c8.m_value[1]) && !NAN(reference1)))
      {
        if ((local_1c8.m_value[2] == reference2) && (!NAN(local_1c8.m_value[2]) && !NAN(reference2))
           ) {
          if ((local_1c8.m_value[3] == reference3) &&
             (!NAN(local_1c8.m_value[3]) && !NAN(reference3))) {
            return;
          }
        }
      }
    }
    local_190._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected ",0x13);
    std::ostream::_M_insert<double>((double)reference0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<double>((double)reference1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<double>((double)reference2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<double>((double)reference3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; got ",6);
    std::ostream::_M_insert<double>((double)local_1c8.m_value[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<double>((double)local_1c8.m_value[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<double>((double)local_1c8.m_value[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<double>((double)local_1c8.m_value[3]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_118);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
    }
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyFloat4Color (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1, GLfloat reference2, GLfloat reference3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[4]> floatVector4;
	glGetFloatv(name, floatVector4);

	if (!floatVector4.verifyValidity(testCtx))
		return;

	if (floatVector4[0] != reference0 ||
		floatVector4[1] != reference1 ||
		floatVector4[2] != reference2 ||
		floatVector4[3] != reference3)
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected "<< reference0 << ", " << reference1 << ", " << reference2 << ", " << reference3
			<< "; got " << floatVector4[0] << ", " << floatVector4[1] << ", " << floatVector4[2] << ", " << floatVector4[3]
			<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}